

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

bool __thiscall
nuraft::raft_server::snapshot_and_compact
          (raft_server *this,ulong committed_idx,bool forced_creation)

{
  element_type *peVar1;
  element_type *peVar2;
  ulong uVar3;
  element_type *peVar4;
  long *plVar5;
  ulong uVar6;
  raft_server *prVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  buffer *buf;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint64_t uVar11;
  ulong uVar12;
  bool f;
  ulong committed_idx_local;
  raft_server *local_100;
  ptr<cluster_config> conf;
  timer_helper tt;
  ulong log_term_to_compact;
  ptr<raft_params> params;
  ptr<snapshot> new_snapshot;
  ptr<snapshot> local_snp;
  handler_type handler;
  string local_50;
  
  committed_idx_local = committed_idx;
  nuraft::context::get_params((context *)&params);
  get_config((raft_server *)&conf);
  uVar12 = (conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           prev_log_idx_;
  iVar10 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_vptr_log_store[2])();
  if (uVar12 < CONCAT44(extraout_var,iVar10)) {
    uVar12 = (ulong)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->snapshot_distance_;
    if (((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         enable_randomized_snapshot_creation_ == true) &&
       (((this->snp_in_progress_)._M_base._M_i & 1U) == 0)) {
      get_last_snapshot((raft_server *)&tt);
      if (tt.t_created_.__d.__r == 0) {
        bVar9 = (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->snapshot_distance_ != 0;
      }
      else {
        bVar9 = false;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tt.duration_us_);
      if (bVar9) {
        uVar12 = (ulong)this->first_snapshot_distance_;
      }
    }
    uVar6 = committed_idx_local;
    if (forced_creation) {
LAB_00192677:
      f = false;
      get_last_snapshot((raft_server *)&local_snp);
      if (((forced_creation) ||
          (local_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0)) ||
         (uVar12 <= committed_idx_local -
                    (local_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->last_log_idx_)) {
        bVar9 = std::atomic<bool>::compare_exchange_strong
                          (&this->snp_in_progress_,&f,true,memory_order_seq_cst);
        if (!bVar9) goto LAB_0019282b;
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_100 = this;
        if (peVar1 != (element_type *)0x0) {
          iVar10 = (**(code **)(*(long *)peVar1 + 0x38))();
          if (3 < iVar10) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&tt,"creating a snapshot for index %lu",committed_idx_local);
            (**(code **)(*(long *)peVar1 + 0x40))
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x209,&tt);
            std::__cxx11::string::~string((string *)&tt);
          }
        }
        while( true ) {
          uVar12 = (conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->log_idx_;
          if (uVar12 <= committed_idx_local) break;
          uVar12 = (conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->prev_log_idx_;
          iVar10 = (*((local_100->log_store_).
                      super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_log_store[3])();
          if (uVar12 < CONCAT44(extraout_var_00,iVar10)) {
            uVar12 = (conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->log_idx_;
            break;
          }
          peVar2 = (local_100->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar2->_vptr_log_store[10])
                    (&tt,peVar2,
                     (conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->prev_log_idx_);
          buf = log_entry::get_buf((log_entry *)tt.t_created_.__d.__r);
          cluster_config::deserialize((cluster_config *)&handler,buf);
          std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)&handler);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&handler.super__Function_base._M_functor + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tt.duration_us_);
        }
        prVar7 = local_100;
        if ((committed_idx_local < uVar12) &&
           (uVar3 = (conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->prev_log_idx_, uVar3 != 0)) {
          iVar10 = (*((local_100->log_store_).
                      super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_log_store[3])();
          if (CONCAT44(extraout_var_02,iVar10) <= uVar3) {
            uVar12 = (conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->log_idx_;
            goto LAB_0019288e;
          }
          if (local_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            peVar1 = (prVar7->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (peVar1 != (element_type *)0x0) {
              iVar10 = (**(code **)(*(long *)peVar1 + 0x38))();
              if (1 < iVar10) {
                peVar1 = (local_100->l_).
                         super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                msg_if_given_abi_cxx11_
                          ((string *)&tt,
                           "No snapshot could be found while no configuration cannot be found in current committed logs, this is a system error, exiting"
                          );
                (**(code **)(*(long *)peVar1 + 0x40))
                          (peVar1,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                           ,"snapshot_and_compact",0x219,&tt);
                std::__cxx11::string::~string((string *)&tt);
              }
            }
            plVar5 = *(long **)&(((local_100->ctx_)._M_t.
                                  super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                  .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                                state_mgr_).
                                super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
            (**(code **)(*plVar5 + 0x40))(plVar5,0xfffffffffffffffa);
            exit(-1);
          }
          std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
                     &((local_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->last_config_).
                      super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>);
        }
        else {
LAB_0019288e:
          if (((committed_idx_local < uVar12) &&
              ((conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->prev_log_idx_ == 0)) &&
             (peVar1 = (prVar7->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr, peVar1 != (element_type *)0x0)) {
            iVar10 = (**(code **)(*(long *)peVar1 + 0x38))();
            if (2 < iVar10) {
              peVar1 = (prVar7->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)&tt,
                         "config at log idx 1 is not availabe, config log idx %lu, prev log idx %lu, committed idx %lu"
                         ,(conf.
                           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->log_idx_,
                         (conf.
                          super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->prev_log_idx_,committed_idx_local);
              (**(code **)(*(long *)peVar1 + 0x40))
                        (peVar1,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                         ,"snapshot_and_compact",0x22a,&tt);
              std::__cxx11::string::~string((string *)&tt);
            }
          }
        }
        peVar2 = (prVar7->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar10 = (*peVar2->_vptr_log_store[0xb])(peVar2,committed_idx_local);
        log_term_to_compact = CONCAT44(extraout_var_03,iVar10);
        std::
        make_shared<nuraft::snapshot,unsigned_long&,unsigned_long&,std::shared_ptr<nuraft::cluster_config>&>
                  ((unsigned_long *)&new_snapshot,&committed_idx_local,
                   (shared_ptr<nuraft::cluster_config> *)&log_term_to_compact);
        peVar1 = (prVar7->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0) {
          iVar10 = (**(code **)(*(long *)peVar1 + 0x38))();
          if (3 < iVar10) {
            peVar1 = (prVar7->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&tt,"create snapshot idx %lu log_term %lu",committed_idx_local,
                       log_term_to_compact);
            (**(code **)(*(long *)peVar1 + 0x40))
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x234,&tt);
            std::__cxx11::string::~string((string *)&tt);
          }
        }
        tt.t_created_.__d.__r = (duration)on_snapshot_completed;
        tt.duration_us_ = 0;
        std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> *)
                   &tt.first_event_fired_,
                   &new_snapshot.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>);
        tt.lock_.super___mutex_base._M_mutex._8_8_ = prVar7;
        std::function<void(bool&,std::shared_ptr<std::exception>&)>::
        function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::snapshot>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>&,bool,std::shared_ptr<std::exception>&)>,void>
                  ((function<void(bool&,std::shared_ptr<std::exception>&)> *)&handler,
                   (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::snapshot>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>_&,_bool,_std::shared_ptr<std::exception>_&)>
                    *)&tt);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tt.lock_);
        timer_helper::timer_helper(&tt,0,false);
        peVar4 = (prVar7->state_machine_).
                 super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar4->_vptr_state_machine[0x12])
                  (peVar4,new_snapshot.
                          super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &handler);
        peVar1 = (prVar7->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0) {
          iVar10 = (**(code **)(*(long *)peVar1 + 0x38))();
          uVar8 = log_term_to_compact;
          uVar6 = committed_idx_local;
          if (3 < iVar10) {
            peVar1 = (prVar7->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            uVar11 = timer_helper::get_us(&tt);
            msg_if_given_abi_cxx11_
                      (&local_50,"create snapshot idx %lu log_term %lu done: %lu us elapsed",uVar6,
                       uVar8,uVar11);
            (**(code **)(*(long *)peVar1 + 0x40))
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x240,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
        std::_Function_base::~_Function_base(&handler.super__Function_base);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&new_snapshot.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar9 = true;
      }
      else {
LAB_0019282b:
        bVar9 = false;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_00192a61;
    }
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        snapshot_distance_ != 0) {
      iVar10 = (*((this->log_store_).
                  super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_log_store[3])();
      if (uVar12 <= (uVar6 - CONCAT44(extraout_var_01,iVar10)) + 1) {
        iVar10 = (*((this->state_machine_).
                    super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_state_machine[0x13])();
        if ((char)iVar10 != '\0') goto LAB_00192677;
      }
    }
  }
  bVar9 = false;
LAB_00192a61:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return bVar9;
}

Assistant:

bool raft_server::snapshot_and_compact(ulong committed_idx, bool forced_creation) {
    ptr<raft_params> params = ctx_->get_params();

    // get the latest configuration info
    ptr<cluster_config> conf = get_config();
    if ( conf->get_prev_log_idx() >= log_store_->next_slot() ) {
        // The latest config and previous config is not in log_store,
        // so skip the snapshot creation.
        return false;
    }

    auto snapshot_distance = (ulong)params->snapshot_distance_;
    // Randomized snapshot distance for the first creation.
    if ( params->enable_randomized_snapshot_creation_ &&
         !snp_in_progress_.load(std::memory_order_relaxed) &&
         !get_last_snapshot() &&
         params->snapshot_distance_ != 0 ) {
        snapshot_distance = first_snapshot_distance_;
    }

    if (!forced_creation) {
        // If `forced_creation == true`, ignore below conditions.
        if ( params->snapshot_distance_ == 0 ||
             ( committed_idx - log_store_->start_index() + 1 ) < snapshot_distance ) {
            // snapshot is disabled or the log store is not long enough
            return false;
        }

        if ( !state_machine_->chk_create_snapshot() ) {
            // User-defined state machine doesn't want to create a snapshot.
            return false;
        }
    }

    bool snapshot_in_action = false;
 try {
    bool f = false;
    ptr<snapshot> local_snp = get_last_snapshot();
    if ( ( forced_creation ||
           !local_snp ||
           ( committed_idx - local_snp->get_last_log_idx() ) >= snapshot_distance ) &&
         snp_in_progress_.compare_exchange_strong(f, true) )
    {
        snapshot_in_action = true;
        p_in("creating a snapshot for index %" PRIu64 "", committed_idx);

        while ( conf->get_log_idx() > committed_idx &&
                conf->get_prev_log_idx() >= log_store_->start_index() ) {
            ptr<log_entry> conf_log
                ( log_store_->entry_at( conf->get_prev_log_idx() ) );
            conf = cluster_config::deserialize(conf_log->get_buf());
        }

        if ( conf->get_log_idx() > committed_idx &&
             conf->get_prev_log_idx() > 0 &&
             conf->get_prev_log_idx() < log_store_->start_index() ) {
            if (!local_snp) {
                // LCOV_EXCL_START
                p_er("No snapshot could be found while no configuration "
                     "cannot be found in current committed logs, "
                     "this is a system error, exiting");
                ctx_->state_mgr_->system_exit(raft_err::N6_no_snapshot_found);
                ::exit(-1);
                return false;
                // LCOV_EXCL_STOP
            }
            conf = local_snp->get_last_config();

        } else if ( conf->get_log_idx() > committed_idx &&
                    conf->get_prev_log_idx() == 0 ) {
            // Modified by Jung-Sang Ahn in May, 2018:
            //  Since we remove configure from state machine
            //  (necessary when we clone a node to another node),
            //  config at log idx 1 may not be visiable in some condition.
            p_wn("config at log idx 1 is not availabe, "
                 "config log idx %" PRIu64 ", prev log idx %" PRIu64
                 ", committed idx %" PRIu64,
                 conf->get_log_idx(), conf->get_prev_log_idx(), committed_idx);
            //ctx_->state_mgr_->system_exit(raft_err::N7_no_config_at_idx_one);
            //::exit(-1);
            //return;
        }

        ulong log_term_to_compact = log_store_->term_at(committed_idx);
        ptr<snapshot> new_snapshot
            ( cs_new<snapshot>(committed_idx, log_term_to_compact, conf) );
        p_in( "create snapshot idx %" PRIu64 " log_term %" PRIu64,
              committed_idx, log_term_to_compact );
        cmd_result<bool>::handler_type handler =
            (cmd_result<bool>::handler_type)
            std::bind( &raft_server::on_snapshot_completed,
                       this,
                       new_snapshot,
                       std::placeholders::_1,
                       std::placeholders::_2 );
        timer_helper tt;
        state_machine_->create_snapshot(*new_snapshot, handler);
        p_in( "create snapshot idx %" PRIu64 " log_term %" PRIu64
              " done: %" PRIu64 " us elapsed",
              committed_idx, log_term_to_compact, tt.get_us() );

        snapshot_in_action = false;
        return true;
    }
    return false;

 } catch (std::exception &e) {
    p_er( "failed to compact logs at index %" PRIu64 " due to errors %s",
          committed_idx, e.what());
    if (snapshot_in_action) {
        bool val = true;
        snp_in_progress_.compare_exchange_strong(val, false);
    }
    return false;
 }
}